

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice_plane.cpp
# Opt level: O3

void __thiscall polyscope::SlicePlane::prepare(SlicePlane *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar1;
  long *plVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  initializer_list<glm::vec<4,_float,_(glm::qualifier)0>_> __l;
  vector<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
  positions;
  element_type *local_128;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_120;
  vector<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
  local_118;
  undefined1 *local_f8 [2];
  undefined1 local_e8 [16];
  vec<4,_float,_(glm::qualifier)0> local_d8;
  undefined8 local_c8;
  undefined1 local_c0 [16];
  undefined4 local_b0;
  undefined1 local_ac [16];
  undefined8 local_9c;
  undefined8 uStack_94;
  undefined8 local_8c;
  undefined4 local_84;
  undefined1 local_80 [16];
  undefined4 local_70;
  undefined8 local_6c;
  undefined4 local_64;
  undefined1 local_60 [16];
  undefined4 local_50;
  undefined1 local_4c [16];
  undefined8 local_3c;
  undefined8 uStack_34;
  undefined8 uStack_2c;
  undefined8 uStack_24;
  undefined4 local_1c;
  
  plVar2 = render::engine;
  local_d8._0_8_ = &local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"SLICE_PLANE","");
  local_118.
  super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.
  super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_118.
  super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (**(code **)(*plVar2 + 0x158))(&local_128,plVar2,&local_d8,&local_118,3);
  p_Var3 = p_Stack_120;
  peVar1 = local_128;
  local_128 = (element_type *)0x0;
  p_Stack_120 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (this->planeProgram).
            super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->planeProgram).
  super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
  (this->planeProgram).
  super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = p_Var3;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    if (p_Stack_120 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_120);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_118);
  if ((undefined8 *)local_d8._0_8_ != &local_c8) {
    operator_delete((void *)local_d8._0_8_);
  }
  local_d8.field_0 = (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)0x0;
  local_d8.field_1 = (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0;
  local_d8.field_2 = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0;
  local_d8.field_3 = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)0x3f800000;
  local_c8 = 0x3f80000000000000;
  local_c0 = ZEXT816(0) << 0x20;
  local_b0 = 0x3f800000;
  local_9c = 0x3f800000;
  uStack_94 = 0xbf80000000000000;
  local_8c = 0;
  local_84 = 0x3f800000;
  local_70 = 0;
  local_6c = vmovlps_avx(SUB6416(ZEXT464(0x3f800000),0));
  local_64 = 0xbf800000;
  local_50 = 0xbf800000;
  local_3c = 0x3f800000;
  uStack_34 = 0x3f80000000000000;
  uStack_2c = 0;
  uStack_24 = 0xbf800000;
  local_1c = 0;
  __l._M_len = 0xc;
  __l._M_array = &local_d8;
  local_ac = local_c0;
  local_80 = local_c0;
  local_60 = local_c0;
  local_4c = local_c0;
  std::
  vector<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
  ::vector(&local_118,__l,(allocator_type *)&local_128);
  peVar1 = (this->planeProgram).
           super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_f8[0] = local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"a_position","");
  (*peVar1->_vptr_ShaderProgram[0x16])(peVar1,local_f8,&local_118);
  if (local_f8[0] != local_e8) {
    operator_delete(local_f8[0]);
  }
  if (local_118.
      super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_118.
                    super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void SlicePlane::prepare() {

  planeProgram = render::engine->requestShader("SLICE_PLANE", {}, render::ShaderReplacementDefaults::Process);

  // Geometry of the plane, using triangles with vertices at infinity
  glm::vec4 cVert{0., 0., 0., 1.};
  glm::vec4 v1{0., 0., 1., 0.};
  glm::vec4 v2{0., 1., 0., 0.};
  glm::vec4 v3{0., 0., -1., 0.};
  glm::vec4 v4{0., -1., 0., 0.};

  // clang-format off
  std::vector<glm::vec4> positions = {
    cVert, v2, v1,
    cVert, v3, v2,
    cVert, v4, v3,
    cVert, v1, v4
  };
  // clang-format on

  planeProgram->setAttribute("a_position", positions);
}